

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O3

void __thiscall
TPZDohrSubstruct<long_double>::Print(TPZDohrSubstruct<long_double> *this,ostream *out)

{
  TPZMatrix<long_double> *pTVar1;
  ostream *poVar2;
  long *plVar3;
  TPZAutoPointer<TPZMatrix<long_double>_> local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"++++++++++++++++++++++++++++++++++++",0x24);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Coarse Index ",0xd);
  poVar2 = ::operator<<(out,&this->fCoarseIndex);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Global Index ",0xd);
  poVar2 = ::operator<<(out,&this->fGlobalIndex);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Internal Nodes ",0xf);
  poVar2 = ::operator<<(out,&this->fInternalEqs);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Coarse Nodes ",0xd);
  poVar2 = ::operator<<(out,&this->fCoarseNodes);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  TPZMatrix<long_double>::Print
            (&(this->fC_star).super_TPZMatrix<long_double>,"fC_star",out,EFormatted);
  TPZMatrix<long_double>::Print
            (&(this->fKeC_star).super_TPZMatrix<long_double>,"fKeC_star",out,EFormatted);
  TPZMatrix<long_double>::Print
            (&(this->fNullPivots).super_TPZMatrix<long_double>,"fNullPivots",out,EFormatted);
  std::__ostream_insert<char,std::char_traits<char>>(out,"fNEquations = ",0xe);
  plVar3 = (long *)std::ostream::operator<<(out,this->fNEquations);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"fCoarseNodes ",0xd);
  poVar2 = ::operator<<(out,&this->fCoarseNodes);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"fCoarseIndex ",0xd);
  poVar2 = ::operator<<(out,&this->fCoarseIndex);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"fGlobalEqs ",0xb);
  poVar2 = ::operator<<(out,&this->fGlobalEqs);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"fInternalEqs ",0xd);
  poVar2 = ::operator<<(out,&this->fInternalEqs);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"fBoundaryEqs ",0xd);
  poVar2 = ::operator<<(out,&this->fBoundaryEqs);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  TPZMatrix<long_double>::Print
            (&(this->fLocalLoad).super_TPZMatrix<long_double>,"fLocalLoad",out,EFormatted);
  TPZMatrix<long_double>::Print
            (&(this->fLocalWeightedResidual).super_TPZMatrix<long_double>,"fLocalWeightedResidual",
             out,EFormatted);
  TPZMatrix<long_double>::Print(&(this->fzi).super_TPZMatrix<long_double>,"fzi",out,EFormatted);
  TPZMatrix<long_double>::Print
            (&(this->fAdjustSolution).super_TPZMatrix<long_double>,"fAdjustSolution",out,EFormatted)
  ;
  TPZMatrix<long_double>::Print
            (&(this->fKCi).super_TPZMatrix<long_double>,"Coarse Matrix",out,EFormatted);
  pTVar1 = ((this->fStiffness).fRef)->fPointer;
  (*(pTVar1->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1c])
            (pTVar1,"Stiffness Matrix",out,2);
  local_38.fRef = (this->fInvertedStiffness).super_TPZMatrixSolver<long_double>.fContainer.fRef;
  LOCK();
  ((local_38.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_38.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  (*((local_38.fRef)->fPointer->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1c])
            ((local_38.fRef)->fPointer,"Matrix Ke",out,2);
  TPZAutoPointer<TPZMatrix<long_double>_>::~TPZAutoPointer(&local_38);
  TPZMatrix<long_double>::Print
            (&(this->fC).super_TPZMatrix<long_double>,"Matrix Ci data structure fC",out,
             EMathematicaInput);
  TPZMatrix<long_double>::Print
            (&(this->fPhiC).super_TPZMatrix<long_double>,"fPhiC = ",out,EMathematicaInput);
  std::__ostream_insert<char,std::char_traits<char>>(out,"fWeights = ",0xb);
  poVar2 = ::operator<<(out,&(this->fWeights).super_TPZVec<long_double>);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  TPZMatrix<long_double>::Print
            (&(this->fPhiC_Weighted_Condensed).super_TPZMatrix<long_double>,
             "fPhiC_Weighted_Condensed = ",out,EFormatted);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Print(std::ostream &out) const
{
	out << "++++++++++++++++++++++++++++++++++++" << std::endl;
	out << "Coarse Index " << fCoarseIndex << std::endl;
	out << "Global Index " << fGlobalIndex << std::endl;
	out << "Internal Nodes " << fInternalEqs << std::endl;
	out << "Coarse Nodes " << fCoarseNodes << std::endl;
	//fEigenVectors.Print("Eigen vectors",out);
	fC_star.Print("fC_star",out);
	fKeC_star.Print("fKeC_star", out);
	fNullPivots.Print("fNullPivots", out);
	out << "fNEquations = " << fNEquations << std::endl;
	out << "fCoarseNodes " << fCoarseNodes << std::endl;
	
	out << "fCoarseIndex " << fCoarseIndex << std::endl;
	
	out << "fGlobalEqs " << fGlobalEqs << std::endl;
	out << "fInternalEqs " << fInternalEqs << std::endl;
	out << "fBoundaryEqs " << fBoundaryEqs << std::endl;
	fLocalLoad.Print("fLocalLoad",out);
	fLocalWeightedResidual.Print("fLocalWeightedResidual",out);
	fzi.Print("fzi", out);
	fAdjustSolution.Print("fAdjustSolution", out);
	
	
	fKCi.Print("Coarse Matrix",out);
	fStiffness->Print("Stiffness Matrix",out,EMathematicaInput);
	fInvertedStiffness.Matrix()->Print("Matrix Ke",out,EMathematicaInput);
	fC.Print("Matrix Ci data structure fC",out,EMathematicaInput);
	//fEigenVectors.Print("Eigenvectors",out,EMathematicaInput);
	fPhiC.Print("fPhiC = ",out,EMathematicaInput);
	out << "fWeights = " << fWeights  << endl;
	fPhiC_Weighted_Condensed.Print("fPhiC_Weighted_Condensed = ", out);
}